

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_scatter2d(Integer g_a,void *v,Integer *i,Integer *j,Integer nv)

{
  short sVar1;
  short sVar2;
  long lVar3;
  logical lVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  Integer _index2_1 [7];
  int _i_8;
  int _ndim_8;
  int _ndim_7;
  int _i_7;
  int _itmp_3;
  int rc_3;
  Integer index_1 [7];
  Integer _index2 [7];
  int _i_6;
  int _ndim_6;
  int _ndim_5;
  int _i_5;
  int _itmp_2;
  int rc_2;
  Integer index [7];
  int rc_1;
  int rc;
  char err_string_5 [256];
  Integer this_count;
  char err_string_4 [256];
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_1;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d;
  Integer _nb;
  Integer _loc;
  Integer _num_rstrctd;
  Integer _jw;
  Integer _iw;
  Integer _p_handle;
  Integer _hi [2];
  Integer _lo [2];
  Integer g_handle;
  Integer proc_place;
  Integer offset;
  Integer _jhi;
  Integer _jlo;
  Integer _ihi;
  Integer _ilo;
  char err_string_3 [256];
  char err_string_2 [256];
  char err_string_1 [256];
  char err_string [256];
  Integer num_blocks;
  char **ptr_ref;
  Integer hi [2];
  Integer lo [2];
  Integer *owner;
  Integer *ldp;
  Integer *jhi;
  Integer *jlo;
  Integer *ihi;
  Integer *ilo;
  armci_giov_t desc;
  void **ptr_org;
  void ***ptr_dst;
  void ***ptr_src;
  Integer *nelem;
  Integer *count;
  Integer handle;
  char *buf2;
  char *buf1;
  Integer *map;
  Integer naproc;
  Integer *aproc;
  Integer subscrpt [2];
  Integer iproc;
  Integer p_handle;
  Integer nproc;
  Integer type;
  Integer proc;
  Integer item_size;
  Integer kk;
  Integer k;
  long in_stack_fffffffffffff5e8;
  armci_giov_t *in_stack_fffffffffffff5f0;
  long alStack_9f8 [7];
  int local_9c0;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  int local_9b0;
  int local_9ac;
  long local_9a8 [8];
  long alStack_968 [7];
  int local_930;
  int local_92c;
  int local_928;
  int local_924;
  int local_920;
  int local_91c;
  long local_918 [7];
  int local_8e0;
  int local_8dc;
  char local_8d8 [96];
  Integer in_stack_fffffffffffff788;
  char *in_stack_fffffffffffff790;
  char local_7c8 [128];
  Integer *in_stack_fffffffffffff8b8;
  void *in_stack_fffffffffffff8c0;
  Integer in_stack_fffffffffffff8c8;
  Integer in_stack_fffffffffffff8d0;
  Integer *in_stack_fffffffffffff8f8;
  Integer *in_stack_fffffffffffff900;
  Integer in_stack_fffffffffffff908;
  Integer in_stack_fffffffffffff910;
  Integer *in_stack_fffffffffffff918;
  Integer *in_stack_fffffffffffff920;
  Integer in_stack_fffffffffffff928;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  int local_6ac;
  int local_6a8 [7];
  int local_68c;
  int local_688;
  int local_684;
  int local_680;
  int local_67c;
  int local_678 [10];
  int local_650;
  int local_64c;
  long local_648;
  long local_640;
  long local_638;
  long local_630;
  long local_628;
  long local_620;
  long local_618;
  long local_610;
  long local_608;
  long local_600;
  long local_5f8;
  long local_5f0;
  long local_5e8;
  long local_5e0;
  C_Integer local_5d8;
  C_Integer local_5d0;
  C_Integer local_5c8;
  long local_5c0;
  armci_giov_t *local_5b8;
  long local_5b0;
  long local_5a8 [4];
  long local_588;
  long local_580;
  long local_578;
  long local_570;
  armci_giov_t *local_568;
  long local_560;
  char local_558 [256];
  char local_458 [256];
  char local_358 [256];
  char local_258 [256];
  long local_158;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  void *local_128;
  undefined8 *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  void *local_c8;
  void *local_c0;
  long local_b8;
  undefined8 *local_b0;
  void *local_a8;
  void *local_a0;
  long local_98;
  void *local_90;
  undefined8 local_88;
  undefined8 local_80;
  long local_70;
  long local_68;
  Integer local_60;
  long local_58;
  ulong local_50;
  size_t local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_58 = (long)GA[in_RDI + 1000].type;
  local_b8 = in_RDI + 1000;
  local_158 = 0;
  if (0 < in_R8) {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
      sprintf(local_258,"%s: INVALID ARRAY HANDLE","ga_scatter");
      pnga_error(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
    }
    if (GA[local_10 + 1000].actv == 0) {
      sprintf(local_358,"%s: ARRAY NOT ACTIVE","ga_scatter");
      pnga_error(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
    }
    GAstat.numsca = GAstat.numsca + 1;
    local_68 = (long)GA[local_b8].p_handle;
    if (local_68 < 0) {
      local_60 = GAnproc;
      if (0 < GA[local_b8].num_rstrctd) {
        local_60 = GA[local_b8].num_rstrctd;
      }
    }
    else {
      local_60 = (Integer)PGRP_LIST[local_68].map_nproc;
    }
    if (GA[local_b8].distr_type == 0) {
      local_a8 = malloc((long)((int)(local_60 << 2) + (int)local_30) << 3);
      if (local_a8 == (void *)0x0) {
        pnga_error(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
      }
    }
    else {
      local_158 = GA[local_b8].block_total;
      local_a8 = malloc((long)((int)(local_158 << 2) + (int)local_30) << 3);
      if (local_a8 == (void *)0x0) {
        pnga_error(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
      }
    }
    local_128 = local_a8;
    local_c0 = (void *)((long)local_a8 + local_30 * 8);
    lVar3 = local_158;
    if (GA[local_b8].distr_type == 0) {
      lVar3 = local_60;
    }
    local_90 = (void *)((long)local_c0 + lVar3 * 0x10);
    local_a0 = (void *)((long)local_c0 + lVar3 * 0x18);
    local_c8 = (void *)((long)local_c0 + lVar3 * 8);
    if (GA[local_b8].distr_type == 0) {
      for (local_40 = 0; local_40 < local_60; local_40 = local_40 + 1) {
        *(undefined8 *)((long)local_c0 + local_40 * 8) = 0;
        *(undefined8 *)((long)local_c8 + local_40 * 8) = 0;
      }
    }
    else {
      for (local_40 = 0; local_40 < local_158; local_40 = local_40 + 1) {
        *(undefined8 *)((long)local_c0 + local_40 * 8) = 0;
        *(undefined8 *)((long)local_c8 + local_40 * 8) = 0;
      }
    }
    if (GA[local_b8].num_rstrctd == 0) {
      for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
        local_88 = *(undefined8 *)(local_20 + local_38 * 8);
        local_80 = *(undefined8 *)(local_28 + local_38 * 8);
        lVar4 = pnga_locate(in_stack_fffffffffffff928,in_stack_fffffffffffff920,
                            in_stack_fffffffffffff918);
        if (lVar4 == 0) {
          sprintf(local_458,"invalid i/j=(%ld,%ld)",*(undefined8 *)(local_20 + local_38 * 8),
                  *(undefined8 *)(local_28 + local_38 * 8));
          pnga_error(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
        }
        local_70 = *(long *)((long)local_128 + local_38 * 8);
        *(long *)((long)local_c8 + local_70 * 8) = *(long *)((long)local_c8 + local_70 * 8) + 1;
      }
    }
    else {
      for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
        local_88 = *(undefined8 *)(local_20 + local_38 * 8);
        local_80 = *(undefined8 *)(local_28 + local_38 * 8);
        lVar4 = pnga_locate(in_stack_fffffffffffff928,in_stack_fffffffffffff920,
                            in_stack_fffffffffffff918);
        if (lVar4 == 0) {
          sprintf(local_558,"invalid i/j=(%ld,%ld)",*(undefined8 *)(local_20 + local_38 * 8),
                  *(undefined8 *)(local_28 + local_38 * 8));
          pnga_error(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
        }
        local_70 = GA[local_b8].rank_rstrctd[*(long *)((long)local_128 + local_38 * 8)];
        *(long *)((long)local_c8 + local_70 * 8) = *(long *)((long)local_c8 + local_70 * 8) + 1;
      }
    }
    local_98 = 0;
    if (GA[local_b8].distr_type == 0) {
      for (local_38 = 0; local_38 < local_60; local_38 = local_38 + 1) {
        if (0 < *(long *)((long)local_c8 + local_38 * 8)) {
          *(long *)((long)local_90 + local_98 * 8) = local_38;
          *(long *)((long)local_a0 + local_38 * 8) = local_98;
          local_98 = local_98 + 1;
        }
      }
    }
    else {
      for (local_38 = 0; local_38 < local_158; local_38 = local_38 + 1) {
        if (0 < *(long *)((long)local_c8 + local_38 * 8)) {
          *(long *)((long)local_90 + local_98 * 8) = local_38;
          *(long *)((long)local_a0 + local_38 * 8) = local_98;
          local_98 = local_98 + 1;
        }
      }
    }
    GAstat.numsca_procs = local_98 + GAstat.numsca_procs;
    local_b0 = (undefined8 *)
               malloc((long)((int)(local_98 << 4) + (int)(local_30 << 4) + (int)local_98 * 0x28 +
                            (int)(local_98 << 3)));
    if (local_b0 == (undefined8 *)0x0) {
      pnga_error(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
    }
    local_d0 = local_b0;
    local_d8 = local_b0 + local_98;
    local_e0 = local_b0 + local_98 * 2;
    local_150 = local_b0 + local_98 * 2 + local_30 * 2;
    local_100 = local_150 + local_98;
    local_108 = local_100 + local_98;
    local_110 = local_108 + local_98;
    local_118 = local_110 + local_98;
    local_120 = local_110 + local_98 + local_98;
    if (GA[local_b8].distr_type == 0) {
      for (local_40 = 0; local_40 < local_98; local_40 = local_40 + 1) {
        local_70 = *(long *)((long)local_90 + local_40 * 8);
        if (0 < GA[local_b8].num_rstrctd) {
          local_70 = GA[local_b8].rstrctd_list[local_70];
        }
        pnga_distribution(in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                          in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
        local_100[local_40] = local_138;
        local_110[local_40] = local_130;
        local_108[local_40] = local_148;
        local_118[local_40] = local_140;
        local_5a8[3] = local_10 + 1000;
        local_5c8 = GA[local_5a8[3]].width[0];
        local_5d0 = GA[local_5a8[3]].width[1];
        local_5d8 = GA[local_5a8[3]].num_rstrctd;
        if (GA[local_5a8[3]].distr_type == 0) {
          if (GA[local_5a8[3]].num_rstrctd == 0) {
            local_600 = (long)GA[local_5a8[3]].ndim;
            local_608 = 0;
            local_5e8 = 1;
            for (local_5f0 = 0; local_5f0 < local_600; local_5f0 = local_5f0 + 1) {
              local_5e8 = GA[local_5a8[3]].nblock[local_5f0] * local_5e8;
            }
            if ((local_5e8 + -1 < *(long *)((long)local_90 + local_40 * 8)) ||
               (*(long *)((long)local_90 + local_40 * 8) < 0)) {
              for (local_5f0 = 0; local_5f0 < local_600; local_5f0 = local_5f0 + 1) {
                local_5a8[local_5f0] = 0;
                (&local_5b8)[local_5f0] = (armci_giov_t *)0xffffffffffffffff;
              }
            }
            else {
              local_5f8 = *(long *)((long)local_90 + local_40 * 8);
              for (local_5f0 = 0; local_5f0 < local_600; local_5f0 = local_5f0 + 1) {
                local_5e0 = local_5f8 % (long)GA[local_5a8[3]].nblock[local_5f0];
                local_5f8 = local_5f8 / (long)GA[local_5a8[3]].nblock[local_5f0];
                local_610 = local_5e0 + local_608;
                local_608 = GA[local_5a8[3]].nblock[local_5f0] + local_608;
                local_5a8[local_5f0] = GA[local_5a8[3]].mapc[local_610];
                if (local_5e0 == GA[local_5a8[3]].nblock[local_5f0] + -1) {
                  (&local_5b8)[local_5f0] = (armci_giov_t *)GA[local_5a8[3]].dims[local_5f0];
                }
                else {
                  (&local_5b8)[local_5f0] =
                       (armci_giov_t *)(GA[local_5a8[3]].mapc[local_610 + 1] + -1);
                }
              }
            }
          }
          else if (*(long *)((long)local_90 + local_40 * 8) < GA[local_5a8[3]].num_rstrctd) {
            local_638 = (long)GA[local_5a8[3]].ndim;
            local_640 = 0;
            local_620 = 1;
            for (local_628 = 0; local_628 < local_638; local_628 = local_628 + 1) {
              local_620 = GA[local_5a8[3]].nblock[local_628] * local_620;
            }
            if ((local_620 + -1 < *(long *)((long)local_90 + local_40 * 8)) ||
               (*(long *)((long)local_90 + local_40 * 8) < 0)) {
              for (local_628 = 0; local_628 < local_638; local_628 = local_628 + 1) {
                local_5a8[local_628] = 0;
                (&local_5b8)[local_628] = (armci_giov_t *)0xffffffffffffffff;
              }
            }
            else {
              local_630 = *(long *)((long)local_90 + local_40 * 8);
              for (local_628 = 0; local_628 < local_638; local_628 = local_628 + 1) {
                local_618 = local_630 % (long)GA[local_5a8[3]].nblock[local_628];
                local_630 = local_630 / (long)GA[local_5a8[3]].nblock[local_628];
                local_648 = local_618 + local_640;
                local_640 = GA[local_5a8[3]].nblock[local_628] + local_640;
                local_5a8[local_628] = GA[local_5a8[3]].mapc[local_648];
                if (local_618 == GA[local_5a8[3]].nblock[local_628] + -1) {
                  (&local_5b8)[local_628] = (armci_giov_t *)GA[local_5a8[3]].dims[local_628];
                }
                else {
                  (&local_5b8)[local_628] =
                       (armci_giov_t *)(GA[local_5a8[3]].mapc[local_648 + 1] + -1);
                }
              }
            }
          }
          else {
            sVar1 = GA[local_5a8[3]].ndim;
            local_650 = (int)sVar1;
            for (local_64c = 0; local_64c < sVar1; local_64c = local_64c + 1) {
              local_5a8[local_64c] = 0;
              (&local_5b8)[local_64c] = (armci_giov_t *)0xffffffffffffffff;
            }
          }
        }
        else if (((GA[local_5a8[3]].distr_type == 1) || (GA[local_5a8[3]].distr_type == 2)) ||
                (GA[local_5a8[3]].distr_type == 3)) {
          sVar1 = GA[local_5a8[3]].ndim;
          local_680 = (int)sVar1;
          sVar2 = GA[local_5a8[3]].ndim;
          local_68c = (int)sVar2;
          local_684 = (int)*(undefined8 *)((long)local_90 + local_40 * 8);
          local_678[0] = (int)((long)local_684 % GA[local_5a8[3]].num_blocks[0]);
          for (local_688 = 1; local_688 < sVar2; local_688 = local_688 + 1) {
            local_684 = (int)((long)(local_684 - local_678[local_688 + -1]) /
                             GA[local_5a8[3]].num_blocks[local_688 + -1]);
            local_678[local_688] = (int)((long)local_684 % GA[local_5a8[3]].num_blocks[local_688]);
          }
          for (local_67c = 0; local_67c < sVar1; local_67c = local_67c + 1) {
            local_5a8[local_67c] =
                 (long)local_678[local_67c] * GA[local_5a8[3]].block_dims[local_67c] + 1;
            (&local_5b8)[local_67c] =
                 (armci_giov_t *)
                 ((long)(local_678[local_67c] + 1) * GA[local_5a8[3]].block_dims[local_67c]);
            if (GA[local_5a8[3]].dims[local_67c] < (long)(&local_5b8)[local_67c]) {
              (&local_5b8)[local_67c] = (armci_giov_t *)GA[local_5a8[3]].dims[local_67c];
            }
          }
        }
        else if (GA[local_5a8[3]].distr_type == 4) {
          sVar1 = GA[local_5a8[3]].ndim;
          local_6b4 = 0;
          sVar2 = GA[local_5a8[3]].ndim;
          local_6b8 = (int)*(undefined8 *)((long)local_90 + local_40 * 8);
          local_6a8[0] = (int)((long)local_6b8 % GA[local_5a8[3]].num_blocks[0]);
          for (local_6bc = 1; local_6bc < sVar2; local_6bc = local_6bc + 1) {
            local_6b8 = (int)((long)(local_6b8 - local_6a8[local_6bc + -1]) /
                             GA[local_5a8[3]].num_blocks[local_6bc + -1]);
            local_6a8[local_6bc] = (int)((long)local_6b8 % GA[local_5a8[3]].num_blocks[local_6bc]);
          }
          for (local_6ac = 0; local_6ac < sVar1; local_6ac = local_6ac + 1) {
            local_5a8[local_6ac] = GA[local_5a8[3]].mapc[local_6b4 + local_6a8[local_6ac]];
            if ((long)local_6a8[local_6ac] < GA[local_5a8[3]].num_blocks[local_6ac] + -1) {
              (&local_5b8)[local_6ac] =
                   (armci_giov_t *)
                   (GA[local_5a8[3]].mapc[local_6b4 + local_6a8[local_6ac] + 1] + -1);
            }
            else {
              (&local_5b8)[local_6ac] = (armci_giov_t *)GA[local_5a8[3]].dims[local_6ac];
            }
            local_6b4 = local_6b4 + (int)GA[local_5a8[3]].num_blocks[local_6ac];
          }
        }
        local_5c0 = (long)GA[local_5a8[3]].p_handle;
        if ((long)GA[local_5a8[3]].p_handle == 0) {
          local_588 = (long)PGRP_LIST->inv_map_proc_list[*(long *)((long)local_90 + local_40 * 8)];
        }
        else {
          local_588 = *(long *)((long)local_90 + local_40 * 8);
          if (local_5d8 != 0) {
            local_588 = GA[local_5a8[3]].rstrctd_list[local_588];
          }
        }
        local_560 = local_5a8[0];
        local_568 = local_5b8;
        local_570 = local_5a8[1];
        local_578 = local_5b0;
        if (((((long)local_100[local_40] < local_5a8[0]) ||
             ((long)local_5b8 < (long)local_100[local_40])) ||
            ((long)local_110[local_40] < local_5a8[1])) || (local_5b0 < (long)local_110[local_40]))
        {
          in_stack_fffffffffffff5e8 = local_5a8[0];
          in_stack_fffffffffffff5f0 = local_5b8;
          sprintf(local_7c8,"%s:p=%ld invalid i/j (%ld,%ld)><(%ld:%ld,%ld:%ld)","gaShmemLocation",
                  *(undefined8 *)((long)local_90 + local_40 * 8),local_100[local_40],
                  local_110[local_40],local_5a8[0],local_5b8,local_5a8[1],local_5b0);
          pnga_error(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
        }
        local_580 = (local_100[local_40] - local_560) + local_5c8 +
                    ((long)local_568 + local_5c8 * 2 + (1 - local_560)) *
                    ((local_110[local_40] - local_570) + local_5d0);
        local_150[local_40] =
             GA[local_5a8[3]].ptr[local_588] +
             local_580 * ga_types[GA[local_5a8[3]].type + -1000].size;
        local_120[local_40] = (long)local_568 + local_5c8 * 2 + (1 - local_560);
      }
    }
    else {
      for (local_40 = 0; local_40 < local_98; local_40 = local_40 + 1) {
        local_70 = *(Integer *)((long)local_90 + local_40 * 8);
        pnga_distribution(in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                          in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
        local_100[local_40] = local_138;
        local_110[local_40] = local_130;
        local_108[local_40] = local_148;
        local_118[local_40] = local_140;
        pnga_access_block_ptr
                  (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                   in_stack_fffffffffffff8b8);
        pnga_release_block(local_10,local_70);
      }
    }
    local_48 = ga_types[local_58 + -1000].size;
    GAbytes.scatot = (double)(long)local_48 * (double)local_30 + GAbytes.scatot;
    local_70 = *(long *)((long)local_128 + GAme * 8);
    GAbytes.scaloc =
         (double)(long)local_48 * (double)*(long *)((long)local_c8 + local_70 * 8) + GAbytes.scaloc;
    *local_d0 = local_e0;
    *local_d8 = local_e0 + local_30;
    for (local_38 = 1; local_38 < local_98; local_38 = local_38 + 1) {
      local_d0[local_38] =
           local_d0[local_38 + -1] +
           *(long *)((long)local_c8 + *(long *)((long)local_90 + (local_38 + -1) * 8) * 8) * 8;
      local_d8[local_38] =
           local_d8[local_38 + -1] +
           *(long *)((long)local_c8 + *(long *)((long)local_90 + (local_38 + -1) * 8) * 8) * 8;
    }
    for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
      local_50 = *(long *)((long)local_128 + local_38 * 8);
      if (0 < GA[local_b8].num_rstrctd) {
        local_50 = GA[local_b8].rank_rstrctd[*(long *)((long)local_128 + local_38 * 8)];
      }
      lVar3 = *(long *)((long)local_c0 + local_50 * 8);
      *(long *)((long)local_c0 + local_50 * 8) = *(long *)((long)local_c0 + local_50 * 8) + 1;
      local_50 = *(ulong *)((long)local_a0 + local_50 * 8);
      *(size_t *)(local_d0[local_50] + lVar3 * 8) = local_18 + local_38 * local_48;
      if (((*(long *)(local_20 + local_38 * 8) < (long)local_100[local_50]) ||
          ((long)local_108[local_50] < *(long *)(local_20 + local_38 * 8))) ||
         ((*(long *)(local_28 + local_38 * 8) < (long)local_110[local_50] ||
          ((long)local_118[local_50] < *(long *)(local_28 + local_38 * 8))))) {
        in_stack_fffffffffffff5e8 = local_108[local_50];
        in_stack_fffffffffffff5f0 = (armci_giov_t *)local_110[local_50];
        sprintf(local_8d8,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",local_50 & 0xffffffff,
                *(undefined8 *)(local_20 + local_38 * 8),*(undefined8 *)(local_28 + local_38 * 8),
                local_100[local_50],in_stack_fffffffffffff5e8,in_stack_fffffffffffff5f0,
                local_118[local_50]);
        pnga_error(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
      }
      *(size_t *)(local_d8[local_50] + lVar3 * 8) =
           local_150[local_50] +
           local_48 *
           (((*(long *)(local_28 + local_38 * 8) - local_110[local_50]) * local_120[local_50] +
            *(long *)(local_20 + local_38 * 8)) - local_100[local_50]);
    }
    if (GA[local_b8].distr_type == 0) {
      for (local_38 = 0; local_38 < local_98; local_38 = local_38 + 1) {
        local_e4 = (undefined4)local_48;
        local_f8 = local_d0[local_38];
        local_f0 = local_d8[local_38];
        local_e8 = (undefined4)
                   *(undefined8 *)((long)local_c8 + *(long *)((long)local_90 + local_38 * 8) * 8);
        if (local_68 < 0) {
          local_70 = *(long *)((long)local_90 + local_38 * 8);
          if (0 < GA[local_b8].num_rstrctd) {
            local_70 = GA[local_b8].rstrctd_list[local_70];
          }
        }
        else {
          local_70 = (long)PGRP_LIST[local_68].inv_map_proc_list
                           [*(long *)((long)local_90 + local_38 * 8)];
        }
        local_8dc = ARMCI_PutV(in_stack_fffffffffffff5f0,
                               (int)((ulong)in_stack_fffffffffffff5e8 >> 0x20),
                               (int)in_stack_fffffffffffff5e8);
        if (local_8dc != 0) {
          pnga_error(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
        }
      }
    }
    else if (GA[local_b8].distr_type == 1) {
      for (local_38 = 0; local_38 < local_98; local_38 = local_38 + 1) {
        local_e4 = (undefined4)local_48;
        local_f8 = local_d0[local_38];
        local_f0 = local_d8[local_38];
        local_e8 = (undefined4)
                   *(undefined8 *)((long)local_c8 + *(long *)((long)local_90 + local_38 * 8) * 8);
        local_70 = *(long *)((long)local_90 + local_38 * 8) % local_60;
        if (-1 < local_68) {
          local_70 = (long)PGRP_LIST[local_68].inv_map_proc_list[local_70];
        }
        local_8e0 = ARMCI_PutV(in_stack_fffffffffffff5f0,
                               (int)((ulong)in_stack_fffffffffffff5e8 >> 0x20),
                               (int)in_stack_fffffffffffff5e8);
        if (local_8e0 != 0) {
          pnga_error(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
        }
      }
    }
    else if (GA[local_b8].distr_type == 2) {
      for (local_38 = 0; local_38 < local_98; local_38 = local_38 + 1) {
        local_e4 = (int)local_48;
        local_f8 = local_d0[local_38];
        local_f0 = local_d8[local_38];
        local_e8 = (int)*(undefined8 *)
                         ((long)local_c8 + *(long *)((long)local_90 + local_38 * 8) * 8);
        local_70 = *(undefined8 *)((long)local_90 + local_38 * 8);
        sVar1 = GA[local_b8].ndim;
        local_928 = (int)sVar1;
        local_920 = (int)local_70;
        local_918[0] = (long)local_920 % GA[local_b8].num_blocks[0];
        for (local_924 = 1; local_924 < sVar1; local_924 = local_924 + 1) {
          local_920 = (int)(((long)local_920 - local_918[local_924 + -1]) /
                           GA[local_b8].num_blocks[local_924 + -1]);
          local_918[local_924] = (long)local_920 % GA[local_b8].num_blocks[local_924];
        }
        local_918[0] = local_918[0] % (long)GA[local_b8].nblock[0];
        local_918[1] = local_918[1] % (long)GA[local_b8].nblock[1];
        local_92c = (int)GA[local_b8].ndim;
        for (local_930 = 0; local_930 < local_92c; local_930 = local_930 + 1) {
          alStack_968[local_930] = local_918[local_930] % (long)GA[local_b8].nblock[local_930];
        }
        local_70 = alStack_968[local_92c + -1];
        for (local_930 = local_92c + -2; -1 < local_930; local_930 = local_930 + -1) {
          local_70 = local_70 * GA[local_b8].nblock[local_930] + alStack_968[local_930];
        }
        if (-1 < local_68) {
          local_70 = (long)PGRP_LIST[local_68].inv_map_proc_list[local_70];
        }
        local_91c = ARMCI_PutV(in_stack_fffffffffffff5f0,
                               (int)((ulong)in_stack_fffffffffffff5e8 >> 0x20),
                               (int)in_stack_fffffffffffff5e8);
        if (local_91c != 0) {
          pnga_error(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
        }
      }
    }
    else if ((GA[local_b8].distr_type == 3) || (GA[local_b8].distr_type == 4)) {
      for (local_38 = 0; local_38 < local_98; local_38 = local_38 + 1) {
        local_e4 = (int)local_48;
        local_f8 = local_d0[local_38];
        local_f0 = local_d8[local_38];
        local_e8 = (int)*(undefined8 *)
                         ((long)local_c8 + *(long *)((long)local_90 + local_38 * 8) * 8);
        local_70 = *(undefined8 *)((long)local_90 + local_38 * 8);
        sVar1 = GA[local_b8].ndim;
        local_9b8 = (int)sVar1;
        local_9b0 = (int)local_70;
        local_9a8[0] = (long)local_9b0 % GA[local_b8].num_blocks[0];
        for (local_9b4 = 1; local_9b4 < sVar1; local_9b4 = local_9b4 + 1) {
          local_9b0 = (int)(((long)local_9b0 - local_9a8[local_9b4 + -1]) /
                           GA[local_b8].num_blocks[local_9b4 + -1]);
          local_9a8[local_9b4] = (long)local_9b0 % GA[local_b8].num_blocks[local_9b4];
        }
        local_9a8[0] = local_9a8[0] % (long)GA[local_b8].nblock[0];
        local_9a8[1] = local_9a8[1] % (long)GA[local_b8].nblock[1];
        local_9bc = (int)GA[local_b8].ndim;
        for (local_9c0 = 0; local_9c0 < local_9bc; local_9c0 = local_9c0 + 1) {
          alStack_9f8[local_9c0] = local_9a8[local_9c0] % (long)GA[local_b8].nblock[local_9c0];
        }
        local_70 = alStack_9f8[local_9bc + -1];
        for (local_9c0 = local_9bc + -2; -1 < local_9c0; local_9c0 = local_9c0 + -1) {
          local_70 = local_70 * GA[local_b8].nblock[local_9c0] + alStack_9f8[local_9c0];
        }
        if (-1 < local_68) {
          local_70 = (long)PGRP_LIST[local_68].inv_map_proc_list[local_70];
        }
        local_9ac = ARMCI_PutV(in_stack_fffffffffffff5f0,
                               (int)((ulong)in_stack_fffffffffffff5e8 >> 0x20),
                               (int)in_stack_fffffffffffff5e8);
        if (local_9ac != 0) {
          pnga_error(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
        }
      }
    }
    free(local_b0);
    free(local_a8);
  }
  return;
}

Assistant:

void pnga_scatter2d(Integer g_a, void *v, Integer *i, Integer *j, Integer nv)
{
    register Integer k;
    Integer kk;
    Integer item_size;
    Integer proc, type=GA[GA_OFFSET + g_a].type;
    Integer nproc, p_handle, iproc;
    Integer subscrpt[2];

    Integer *aproc, naproc; /* active processes and numbers */
    Integer *map;           /* map the active processes to allocated space */
    char *buf1, *buf2;
    Integer handle = g_a + GA_OFFSET;
    
    Integer *count;   /* counters for each process */
    Integer *nelem;   /* number of elements for each process */
    /* source and destination pointers for each process */
    void ***ptr_src, ***ptr_dst; 
    void **ptr_org; /* the entire pointer array */
    armci_giov_t desc;
    Integer *ilo, *ihi, *jlo, *jhi, *ldp, *owner;
    Integer lo[2], hi[2];
    char **ptr_ref;
    Integer num_blocks=0;
    
    if (nv < 1) return;
    
    ga_check_handleM(g_a, "ga_scatter");
    
    GAstat.numsca++;
    /* determine how many processors are associated with array */
    p_handle = GA[handle].p_handle;
    if (p_handle < 0) {
      nproc = GAnproc;
      if (GA[handle].num_rstrctd > 0) {
        nproc = GA[handle].num_rstrctd;
      }
    } else {
      nproc = PGRP_LIST[p_handle].map_nproc;
    }
    
    /* allocate temp memory */
    if (GA[handle].distr_type == REGULAR) {
      buf1 = malloc((int) (nproc *4 +nv)* (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*nproc);
    } else {
      num_blocks = GA[handle].block_total;
      buf1 = malloc((int) (num_blocks *4 +nv)* (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*num_blocks);
    }
   
    owner = (Integer *)buf1;  
    count = owner+ nv;  
    if (GA[handle].distr_type == REGULAR) {
      nelem =  count + nproc;  
      aproc = count + 2 * nproc;  
      map = count + 3 * nproc;  
    } else {
      nelem =  count + num_blocks;  
      aproc = count + 2 * num_blocks;  
      map = count + 3 * num_blocks;  
    }

    /* initialize the counters and nelem */
    if (GA[handle].distr_type == REGULAR) {
      for(kk=0; kk<nproc; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    } else {
      for(kk=0; kk<num_blocks; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    }
    
    /* find proc that owns the (i,j) element; store it in temp:  */
    if (GA[handle].num_rstrctd == 0) {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string,g_a);
        }
        iproc = owner[k];
        nelem[iproc]++;
      }
    } else {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string,g_a);
        }
        iproc = GA[handle].rank_rstrctd[owner[k]];
        nelem[iproc]++;
      }
    }

    naproc = 0;
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<nproc; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    } else {
      for(k=0; k<num_blocks; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    }
    
    GAstat.numsca_procs += naproc;

    buf2 = malloc((int)(2*naproc*sizeof(void **) + 2*nv*sizeof(void *) +
                      5*naproc*sizeof(Integer) + naproc*sizeof(char*)));
    if(buf2 == NULL) pnga_error("malloc failed", naproc);
 
    ptr_src = (void ***)buf2;
    ptr_dst = (void ***)(buf2 + naproc*sizeof(void **));
    ptr_org = (void **)(buf2 + 2*naproc*sizeof(void **));
    ptr_ref = (char **)(buf2+2*naproc*sizeof(void **)+2*nv*sizeof(void *));
    ilo = (Integer *)(((char*)ptr_ref) + naproc*sizeof(char*));
    ihi = ilo + naproc;
    jlo = ihi + naproc;
    jhi = jlo + naproc;
    ldp = jhi + naproc;

    if (GA[handle].distr_type == REGULAR) {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        if (GA[handle].num_rstrctd > 0)
                    iproc = GA[handle].rstrctd_list[iproc];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        gaShmemLocation(aproc[kk], g_a, ilo[kk], jlo[kk], &(ptr_ref[kk]),
            &(ldp[kk]));
      }
    } else {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        pnga_access_block_ptr(g_a, iproc, &(ptr_ref[kk]), &(ldp[kk]));
        pnga_release_block(g_a, iproc);
      }
    }
    
    /* determine limit for message size --  v,i, & j will travel together */
    item_size = GAsizeofM(type);
    GAbytes.scatot += (double)item_size*nv ;
    iproc = owner[GAme];
    GAbytes.scaloc += (double)item_size* nelem[iproc];
    ptr_src[0] = ptr_org; ptr_dst[0] = ptr_org + nv;
    for(k=1; k<naproc; k++) {
        ptr_src[k] = ptr_src[k-1] + nelem[aproc[k-1]];
        ptr_dst[k] = ptr_dst[k-1] + nelem[aproc[k-1]];
    }
    
    for(k=0; k<nv; k++){
        Integer this_count;
        proc = owner[k];
        if (GA[handle].num_rstrctd > 0)
                    proc = GA[handle].rank_rstrctd[owner[k]];
        this_count = count[proc]; 
        count[proc]++;
        proc = map[proc];
        ptr_src[proc][this_count] = ((char*)v) + k * item_size;

        if(i[k] < ilo[proc] || i[k] > ihi[proc]  ||
           j[k] < jlo[proc] || j[k] > jhi[proc]){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",
             (int)proc, (long)i[k], (long)j[k], (long)ilo[proc], 
             (long)ihi[proc], (long)jlo[proc], (long)jhi[proc]);
            pnga_error(err_string, g_a);
        }
        ptr_dst[proc][this_count] = ptr_ref[proc] + item_size *
            ((j[k] - jlo[proc])* ldp[proc] + i[k] - ilo[proc]);
    }
    
    /* source and destination pointers are ready for all processes */
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        if (p_handle < 0) {
          iproc = aproc[k];
          if (GA[handle].num_rstrctd > 0)
            iproc = GA[handle].rstrctd_list[iproc];
        } else {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[aproc[k]];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        iproc = iproc%nproc;
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_proc_from_sl_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_tile_proc_from_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
        }

        rc = ARMCI_PutV(&desc, 1, (int)iproc);
        if(rc) pnga_error("scatter failed in armci",rc);
      }
    }

    free(buf2);
    free(buf1);

}